

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

uint256 * __thiscall
jbcoin::STObject::getSigningHash(uint256 *__return_storage_ptr__,STObject *this,uint32_t prefix)

{
  Serializer s;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  Serializer::Serializer((Serializer *)&_Stack_38,0x100);
  Serializer::add32((Serializer *)&_Stack_38,prefix);
  add(this,(Serializer *)&_Stack_38,false);
  Serializer::getSHA512Half(__return_storage_ptr__,(Serializer *)&_Stack_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

uint256 STObject::getSigningHash (std::uint32_t prefix) const
{
    Serializer s;
    s.add32 (prefix);
    add (s, false);
    return s.getSHA512Half ();
}